

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall
DGlow2::DGlow2(DGlow2 *this,sector_t *sector,int start,int end,int tics,bool oneshot)

{
  short sVar1;
  bool oneshot_local;
  int tics_local;
  int end_local;
  int start_local;
  sector_t *sector_local;
  DGlow2 *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f7ab8;
  sVar1 = sector_t::ClampLight(start);
  this->m_Start = (int)sVar1;
  sVar1 = sector_t::ClampLight(end);
  this->m_End = (int)sVar1;
  this->m_MaxTics = tics;
  this->m_Tics = -1;
  this->m_OneShot = oneshot;
  return;
}

Assistant:

DGlow2::DGlow2 (sector_t *sector, int start, int end, int tics, bool oneshot)
	: DLighting (sector)
{
	m_Start = sector_t::ClampLight(start);
	m_End = sector_t::ClampLight(end);
	m_MaxTics = tics;
	m_Tics = -1;
	m_OneShot = oneshot;
}